

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalflatset_p.h
# Opt level: O0

pair<QWindow_*const_*,_bool> __thiscall
QMinimalFlatSet<QWindow_*,_QVarLengthArray<QWindow_*,_20LL>,_std::less<QWindow_*>_>::insert
          (QMinimalFlatSet<QWindow_*,_QVarLengthArray<QWindow_*,_20LL>,_std::less<QWindow_*>_> *this
          ,value_type *v)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  long in_FS_OFFSET;
  R_conflict RVar2;
  pair<QWindow_*const_*,_bool> pVar3;
  R_conflict r;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  QVarLengthArray<QWindow_*,_20LL> *in_stack_ffffffffffffffa0;
  bool local_39;
  iterator local_38;
  undefined7 in_stack_ffffffffffffffd0;
  bool in_stack_ffffffffffffffd7;
  pair<QWindow_*const_*,_bool> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  RVar2 = lookup((QMinimalFlatSet<QWindow_*,_QVarLengthArray<QWindow_*,_20LL>,_std::less<QWindow_*>_>
                  *)&DAT_aaaaaaaaaaaaaaaa,
                 (value_type *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  if (((undefined1  [16])RVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_38 = QVarLengthArray<QWindow_*,_20LL>::insert
                         (in_stack_ffffffffffffffa0,
                          (const_iterator)
                          CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                          (QWindow **)0x3736cb);
    local_39 = true;
    std::pair<QWindow_*const_*,_bool>::pair<QWindow_**,_bool,_true>(&local_18,&local_38,&local_39);
    uVar1 = extraout_RDX_00;
  }
  else {
    std::pair<QWindow_*const_*,_bool>::pair<bool,_true>
              (&local_18,(QWindow ***)&stack0xffffffffffffffd8,(bool *)&stack0xffffffffffffffd7);
    uVar1 = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    pVar3._9_7_ = (undefined7)((ulong)uVar1 >> 8);
    pVar3.second = local_18.second;
    pVar3.first = local_18.first;
    return pVar3;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<iterator, bool> insert(const value_type &v)
    {
        QMINIMAL_FLAT_SET_PRINT_AT_END
        const auto r = lookup(v);
        if (r.exists)
            return {r.it, false};
        else
            return {c.insert(r.it, v), true};
    }